

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coreTypeOperations.cpp
# Opt level: O0

bool helics::core::isCoreTypeAvailable(CoreType type)

{
  bool available;
  CoreType type_local;
  
  available = false;
  switch(type) {
  case DEFAULT:
  case EMPTY:
    available = true;
    break;
  case ZMQ:
  case ZMQ_SS:
    available = true;
    break;
  case MPI:
    available = false;
    break;
  case TEST:
    available = false;
    break;
  case INTERPROCESS:
  case IPC:
    available = true;
    break;
  case TCP:
  case TCP_SS:
    available = true;
    break;
  case UDP:
    available = true;
    break;
  default:
    break;
  case HTTP:
  case WEBSOCKET:
    return false;
  case INPROC:
    available = true;
    break;
  case NULLCORE:
    available = false;
  }
  return available;
}

Assistant:

bool isCoreTypeAvailable(CoreType type) noexcept
{
    bool available{false};

    switch (type) {
        case CoreType::ZMQ:
        case CoreType::ZMQ_SS:
            available = zmq_availability;
            break;
        case CoreType::MPI:
            available = mpi_availability;
            break;
        case CoreType::TEST:
            available = test_availability;
            break;
        case CoreType::INTERPROCESS:
        case CoreType::IPC:
            available = ipc_availability;
            break;
        case CoreType::UDP:
            available = udp_availability;
            break;
        case CoreType::TCP:
        case CoreType::TCP_SS:
            available = tcp_availability;
            break;
        case CoreType::DEFAULT:  // default and empty should always be available
        case CoreType::EMPTY:
            available = true;
            break;
        case CoreType::INPROC:
            available = inproc_availability;
            break;
        case CoreType::HTTP:
        case CoreType::WEBSOCKET:
            return false;  // these are not yet built
            break;
        case CoreType::NULLCORE:
            available = false;  // nullcore is never available
            break;
        default:
            break;
    }

    return available;
}